

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O0

void __thiscall sptk::SpectrumToSpectrum::~SpectrumToSpectrum(SpectrumToSpectrum *this)

{
  void *in_RDI;
  SpectrumToSpectrum *unaff_retaddr;
  
  ~SpectrumToSpectrum(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

SpectrumToSpectrum::~SpectrumToSpectrum() {
  for (std::vector<SpectrumToSpectrum::OperationInterface*>::iterator itr(
           operations_.begin());
       itr != operations_.end(); ++itr) {
    delete (*itr);
  }
}